

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  TokenType TVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 != TYPE_IDENTIFIER) {
    if (this->allow_field_number_ == false) {
      if ((TVar1 != TYPE_INTEGER) || (this->allow_unknown_field_ == false)) goto LAB_005c5f21;
    }
    else if (TVar1 != TYPE_INTEGER) {
LAB_005c5f21:
      std::operator+(&local_30,"Expected identifier, got: ",&(this->tokenizer_).current_.text);
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_30
                 );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  std::__cxx11::string::_M_assign((string *)identifier);
  io::Tokenizer::Next(&this->tokenizer_);
  return true;
}

Assistant:

bool ConsumeIdentifier(string* identifier) {
    if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    // If allow_field_numer_ or allow_unknown_field_ is true, we should able
    // to parse integer identifiers.
    if ((allow_field_number_ || allow_unknown_field_)
        && LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    ReportError("Expected identifier, got: " + tokenizer_.current().text);
    return false;
  }